

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_platform.h
# Opt level: O0

ui32_t Kumu::Swap4(ui32_t i)

{
  ui32_t i_local;
  
  return i << 0x18 | i >> 0x18 | (i & 0xff00) << 8 | i >> 8 & 0xff00;
}

Assistant:

inline ui32_t Swap4(ui32_t i)
    {
      return
	( (i & 0x000000ffUL) << 24 ) |
	( (i & 0xff000000UL) >> 24 ) |
	( (i & 0x0000ff00UL) << 8  ) |
	( (i & 0x00ff0000UL) >> 8  );
    }